

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
* AssemblyCode::buildInterferentGraph
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *__return_storage_ptr__,
            vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *lines,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *ignoreList)

{
  bool bVar1;
  reference pCVar2;
  undefined1 local_100 [8];
  CodeLine line;
  iterator __end1;
  iterator __begin1;
  vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignoreList_local;
  vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *lines_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *graph;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(__return_storage_ptr__);
  addVertices(lines,__return_storage_ptr__,ignoreList);
  __end1 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::begin
                     (lines);
  line._168_8_ = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::end
                           (lines);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<AssemblyCode::CodeLine_*,_std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>_>
                                     *)&line.isMoveRegReg), bVar1) {
    pCVar2 = __gnu_cxx::
             __normal_iterator<AssemblyCode::CodeLine_*,_std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>_>
             ::operator*(&__end1);
    CodeLine::CodeLine((CodeLine *)local_100,pCVar2);
    processLine((CodeLine *)local_100,__return_storage_ptr__,ignoreList);
    CodeLine::~CodeLine((CodeLine *)local_100);
    __gnu_cxx::
    __normal_iterator<AssemblyCode::CodeLine_*,_std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::set<std::string>> AssemblyCode::buildInterferentGraph(std::vector<AssemblyCode::CodeLine>& lines,
                                                                                 std::vector<std::string>& ignoreList) {
    std::map<std::string, std::set<std::string>> graph;

    addVertices(lines, graph, ignoreList);

    for (auto line : lines) {
        processLine(line, graph, ignoreList);
    }

    return graph;
}